

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O3

void uiter_setUTF16BE_63(UCharIterator *iter,char *s,int32_t length)

{
  long lVar1;
  uint uVar2;
  UCharIterator *pUVar3;
  UCharIterator *pUVar4;
  
  if (iter == (UCharIterator *)0x0) {
    return;
  }
  if (s == (char *)0x0) {
LAB_002d7577:
    pUVar3 = &noopIterator;
    for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
      iter->context = pUVar3->context;
      pUVar3 = (UCharIterator *)&pUVar3->length;
      iter = (UCharIterator *)&iter->length;
    }
  }
  else {
    if (length == -1) {
      pUVar3 = &utf16BEIterator;
      pUVar4 = iter;
      for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
        pUVar4->context = pUVar3->context;
        pUVar3 = (UCharIterator *)&pUVar3->length;
        pUVar4 = (UCharIterator *)&pUVar4->length;
      }
      iter->context = s;
      if (((ulong)s & 1) == 0) {
        uVar2 = u_strlen_63((UChar *)s);
      }
      else {
        for (lVar1 = 0; (s[lVar1] != '\0' || (s[lVar1 + 1] != '\0')); lVar1 = lVar1 + 2) {
        }
        uVar2 = (uint)((ulong)(lVar1 - (lVar1 >> 0x3f)) >> 1);
      }
    }
    else {
      if ((length & 0x80000001U) != 0) goto LAB_002d7577;
      uVar2 = (uint)length >> 1;
      pUVar3 = &utf16BEIterator;
      pUVar4 = iter;
      for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
        pUVar4->context = pUVar3->context;
        pUVar3 = (UCharIterator *)&pUVar3->length;
        pUVar4 = (UCharIterator *)&pUVar4->length;
      }
      iter->context = s;
    }
    iter->length = uVar2;
    iter->limit = uVar2;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uiter_setUTF16BE(UCharIterator *iter, const char *s, int32_t length) {
    if(iter!=NULL) {
        /* allow only even-length strings (the input length counts bytes) */
        if(s!=NULL && (length==-1 || (length>=0 && IS_EVEN(length)))) {
            /* length/=2, except that >>=1 also works for -1 (-1/2==0, -1>>1==-1) */
            length>>=1;

            if(U_IS_BIG_ENDIAN && IS_POINTER_EVEN(s)) {
                /* big-endian machine and 2-aligned UTF-16BE string: use normal UChar iterator */
                uiter_setString(iter, (const UChar *)s, length);
                return;
            }

            *iter=utf16BEIterator;
            iter->context=s;
            if(length>=0) {
                iter->length=length;
            } else {
                iter->length=utf16BE_strlen(s);
            }
            iter->limit=iter->length;
        } else {
            *iter=noopIterator;
        }
    }
}